

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElement.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::TextElement::dump_abi_cxx11_
          (string *__return_storage_ptr__,TextElement *this,int level)

{
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  TextElement *pTStack_18;
  int level_local;
  TextElement *this_local;
  
  local_1c = level;
  pTStack_18 = this;
  this_local = (TextElement *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,(long)level,'\t',&local_61);
  std::operator+(&local_40,&local_60,"TextElement: ");
  std::operator+(__return_storage_ptr__,&local_40,&this->text);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::TextElement::dump(int level) const {
    return std::string(level, '\t')+"TextElement: "+this->text;
}